

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkAlloc(Abc_NtkType_t Type,Abc_NtkFunc_t Func,int fUseMemMan)

{
  uint uVar1;
  int iVar2;
  Abc_Ntk_t *pNtkAig;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  Vec_Ptr_t *pVVar5;
  Mem_Fixed_t *pMVar6;
  Mem_Step_t *pMVar7;
  DdManager *pDVar8;
  Nm_Man_t *pNVar9;
  
  pNtkAig = (Abc_Ntk_t *)calloc(1,0x1c8);
  pNtkAig->ntkType = Type;
  pNtkAig->ntkFunc = Func;
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  pVVar3->nCap = 100;
  pVVar3->nSize = 0;
  ppvVar4 = (void **)malloc(800);
  pVVar3->pArray = ppvVar4;
  pNtkAig->vObjs = pVVar3;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  ppvVar4 = (void **)malloc(800);
  pVVar5->pArray = ppvVar4;
  pNtkAig->vPios = pVVar5;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  ppvVar4 = (void **)malloc(800);
  pVVar5->pArray = ppvVar4;
  pNtkAig->vPis = pVVar5;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  ppvVar4 = (void **)malloc(800);
  pVVar5->pArray = ppvVar4;
  pNtkAig->vPos = pVVar5;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  ppvVar4 = (void **)malloc(800);
  pVVar5->pArray = ppvVar4;
  pNtkAig->vCis = pVVar5;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  ppvVar4 = (void **)malloc(800);
  pVVar5->pArray = ppvVar4;
  pNtkAig->vCos = pVVar5;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  ppvVar4 = (void **)malloc(800);
  pVVar5->pArray = ppvVar4;
  pNtkAig->vBoxes = pVVar5;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  ppvVar4 = (void **)malloc(800);
  pVVar5->pArray = ppvVar4;
  pNtkAig->vLtlProperties = pVVar5;
  if (fUseMemMan == 0) {
    pNtkAig->pMmObj = (Mem_Fixed_t *)0x0;
    pMVar7 = (Mem_Step_t *)0x0;
  }
  else {
    pMVar6 = Mem_FixedStart(0x48);
    pNtkAig->pMmObj = pMVar6;
    pMVar7 = Mem_StepStart(10);
  }
  pNtkAig->pMmStep = pMVar7;
  pNtkAig->nTravIds = 1;
  if (Type == ABC_NTK_STRASH) {
    pDVar8 = (DdManager *)Abc_AigAlloc(pNtkAig);
  }
  else {
    uVar1 = pVVar3->nSize;
    if (uVar1 == pVVar3->nCap) {
      if ((int)uVar1 < 0x10) {
        if (pVVar3->pArray == (void **)0x0) {
          ppvVar4 = (void **)malloc(0x80);
        }
        else {
          ppvVar4 = (void **)realloc(pVVar3->pArray,0x80);
        }
        pVVar3->pArray = ppvVar4;
        pVVar3->nCap = 0x10;
      }
      else {
        if (pVVar3->pArray == (void **)0x0) {
          ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
        }
        else {
          ppvVar4 = (void **)realloc(pVVar3->pArray,(ulong)uVar1 << 4);
        }
        pVVar3->pArray = ppvVar4;
        pVVar3->nCap = uVar1 * 2;
      }
    }
    else {
      ppvVar4 = pVVar3->pArray;
    }
    iVar2 = pVVar3->nSize;
    pVVar3->nSize = iVar2 + 1;
    ppvVar4[iVar2] = (void *)0x0;
    switch(Func) {
    case ABC_FUNC_SOP:
    case ABC_FUNC_BLIFMV:
      pDVar8 = (DdManager *)Mem_FlexStart();
      break;
    case ABC_FUNC_BDD:
      pDVar8 = Cudd_Init(0x14,0,0x100,0x40000,0);
      break;
    case ABC_FUNC_AIG:
      pDVar8 = (DdManager *)Hop_ManStart();
      break;
    case ABC_FUNC_MAP:
      pDVar8 = (DdManager *)Abc_FrameReadLibGen();
      break;
    case ABC_FUNC_BLACKBOX:
      goto switchD_001ea10e_caseD_6;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNtk.c"
                    ,0x5a,"Abc_Ntk_t *Abc_NtkAlloc(Abc_NtkType_t, Abc_NtkFunc_t, int)");
    }
  }
  pNtkAig->pManFunc = pDVar8;
switchD_001ea10e_caseD_6:
  pNVar9 = Nm_ManCreate(200);
  pNtkAig->pManName = pNVar9;
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  pVVar3->nCap = 0xf;
  ppvVar4 = (void **)calloc(1,0x78);
  pVVar3->pArray = ppvVar4;
  pVVar3->nSize = 0xf;
  pNtkAig->vAttrs = pVVar3;
  pNtkAig->AndGateDelay = 0.0;
  return pNtkAig;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Creates a new Ntk.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Abc_Ntk_t * Abc_NtkAlloc( Abc_NtkType_t Type, Abc_NtkFunc_t Func, int fUseMemMan )
{
    Abc_Ntk_t * pNtk;
    pNtk = ABC_ALLOC( Abc_Ntk_t, 1 );
    memset( pNtk, 0, sizeof(Abc_Ntk_t) );
    pNtk->ntkType     = Type;
    pNtk->ntkFunc     = Func;
    // start the object storage
    pNtk->vObjs       = Vec_PtrAlloc( 100 );
    pNtk->vPios       = Vec_PtrAlloc( 100 );
    pNtk->vPis        = Vec_PtrAlloc( 100 );
    pNtk->vPos        = Vec_PtrAlloc( 100 );
    pNtk->vCis        = Vec_PtrAlloc( 100 );
    pNtk->vCos        = Vec_PtrAlloc( 100 );
    pNtk->vBoxes      = Vec_PtrAlloc( 100 );
	pNtk->vLtlProperties = Vec_PtrAlloc( 100 );
    // start the memory managers
    pNtk->pMmObj      = fUseMemMan? Mem_FixedStart( sizeof(Abc_Obj_t) ) : NULL;
    pNtk->pMmStep     = fUseMemMan? Mem_StepStart( ABC_NUM_STEPS ) : NULL;
    // get ready to assign the first Obj ID
    pNtk->nTravIds    = 1;
    // start the functionality manager
    if ( !Abc_NtkIsStrash(pNtk) )
        Vec_PtrPush( pNtk->vObjs, NULL );
    if ( Abc_NtkIsStrash(pNtk) )
        pNtk->pManFunc = Abc_AigAlloc( pNtk );
    else if ( Abc_NtkHasSop(pNtk) || Abc_NtkHasBlifMv(pNtk) )
        pNtk->pManFunc = Mem_FlexStart();
#ifdef ABC_USE_CUDD
    else if ( Abc_NtkHasBdd(pNtk) )
        pNtk->pManFunc = Cudd_Init( 20, 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
#endif
    else if ( Abc_NtkHasAig(pNtk) )
        pNtk->pManFunc = Hop_ManStart();
    else if ( Abc_NtkHasMapping(pNtk) )
        pNtk->pManFunc = Abc_FrameReadLibGen();
    else if ( !Abc_NtkHasBlackbox(pNtk) )
        assert( 0 );
    // name manager
    pNtk->pManName = Nm_ManCreate( 200 );
    // attribute manager
    pNtk->vAttrs = Vec_PtrStart( VEC_ATTR_TOTAL_NUM );
    // estimated AndGateDelay
    pNtk->AndGateDelay = 0.0;
    return pNtk;
}